

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O0

void Abc_NtkSimulteBuggyMiter(Abc_Ntk_t *pNtk)

{
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  int *pModel;
  Abc_Obj_t *pAVar5;
  uint *__ptr;
  int *pModel_00;
  uint *__ptr_00;
  char *vPiValues2;
  char *vPiValues1;
  int *pResult2;
  int *pResult1;
  int *pModel2;
  int *pModel1;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  sVar4 = strlen("01001011100000000011010110101000000");
  uVar2 = Abc_NtkPiNum(pNtk);
  if (sVar4 != uVar2) {
    __assert_fail("strlen(vPiValues1) == (unsigned)Abc_NtkPiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcVerify.c"
                  ,0x402,"void Abc_NtkSimulteBuggyMiter(Abc_Ntk_t *)");
  }
  iVar3 = Abc_NtkPoNum(pNtk);
  if (iVar3 == 1) {
    iVar3 = Abc_NtkCiNum(pNtk);
    pModel = (int *)malloc((long)iVar3 << 2);
    for (pModel1._4_4_ = 0; iVar3 = Abc_NtkPiNum(pNtk), pModel1._4_4_ < iVar3;
        pModel1._4_4_ = pModel1._4_4_ + 1) {
      Abc_NtkPi(pNtk,pModel1._4_4_);
      pModel[pModel1._4_4_] = "01001011100000000011010110101000000"[pModel1._4_4_] + -0x30;
    }
    for (pModel1._4_4_ = 0; iVar3 = Vec_PtrSize(pNtk->vBoxes), pModel1._4_4_ < iVar3;
        pModel1._4_4_ = pModel1._4_4_ + 1) {
      pAVar5 = Abc_NtkBox(pNtk,pModel1._4_4_);
      iVar3 = Abc_ObjIsLatch(pAVar5);
      if (iVar3 != 0) {
        aVar1 = pAVar5->field_5;
        iVar3 = Abc_NtkPiNum(pNtk);
        pModel[iVar3 + pModel1._4_4_] = aVar1.iData + -1;
      }
    }
    __ptr = (uint *)Abc_NtkVerifySimulatePattern(pNtk,pModel);
    printf("Value = %d\n",(ulong)*__ptr);
    iVar3 = Abc_NtkCiNum(pNtk);
    pModel_00 = (int *)malloc((long)iVar3 << 2);
    for (pModel1._4_4_ = 0; iVar3 = Abc_NtkPiNum(pNtk), pModel1._4_4_ < iVar3;
        pModel1._4_4_ = pModel1._4_4_ + 1) {
      Abc_NtkPi(pNtk,pModel1._4_4_);
      pModel_00[pModel1._4_4_] = "11001101011101011111110100100010001"[pModel1._4_4_] + -0x30;
    }
    for (pModel1._4_4_ = 0; iVar3 = Vec_PtrSize(pNtk->vBoxes), pModel1._4_4_ < iVar3;
        pModel1._4_4_ = pModel1._4_4_ + 1) {
      pAVar5 = Abc_NtkBox(pNtk,pModel1._4_4_);
      iVar3 = Abc_ObjIsLatch(pAVar5);
      if (iVar3 != 0) {
        iVar3 = Abc_NtkPoNum(pNtk);
        uVar2 = __ptr[iVar3 + pModel1._4_4_];
        iVar3 = Abc_NtkPiNum(pNtk);
        pModel_00[iVar3 + pModel1._4_4_] = uVar2;
      }
    }
    __ptr_00 = (uint *)Abc_NtkVerifySimulatePattern(pNtk,pModel_00);
    printf("Value = %d\n",(ulong)*__ptr_00);
    if (pModel != (int *)0x0) {
      free(pModel);
    }
    if (pModel_00 != (int *)0x0) {
      free(pModel_00);
    }
    if (__ptr != (uint *)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (uint *)0x0) {
      free(__ptr_00);
    }
    return;
  }
  __assert_fail("1 == Abc_NtkPoNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcVerify.c"
                ,0x403,"void Abc_NtkSimulteBuggyMiter(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkSimulteBuggyMiter( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    int * pModel1, * pModel2, * pResult1, * pResult2;
    char * vPiValues1 = "01001011100000000011010110101000000";
    char * vPiValues2 = "11001101011101011111110100100010001";

    assert( strlen(vPiValues1) == (unsigned)Abc_NtkPiNum(pNtk) );
    assert( 1 == Abc_NtkPoNum(pNtk) );

    pModel1 = ABC_ALLOC( int, Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachPi( pNtk, pObj, i )
        pModel1[i] = vPiValues1[i] - '0';
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pModel1[Abc_NtkPiNum(pNtk)+i] = ((int)(ABC_PTRINT_T)pObj->pData) - 1;

    pResult1 = Abc_NtkVerifySimulatePattern( pNtk, pModel1 );
    printf( "Value = %d\n", pResult1[0] );

    pModel2 = ABC_ALLOC( int, Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachPi( pNtk, pObj, i )
        pModel2[i] = vPiValues2[i] - '0';
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pModel2[Abc_NtkPiNum(pNtk)+i] = pResult1[Abc_NtkPoNum(pNtk)+i];

    pResult2 = Abc_NtkVerifySimulatePattern( pNtk, pModel2 );
    printf( "Value = %d\n", pResult2[0] );

    ABC_FREE( pModel1 );
    ABC_FREE( pModel2 );
    ABC_FREE( pResult1 );
    ABC_FREE( pResult2 );
}